

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifMan.c
# Opt level: O0

void If_ManSetupSetAll(If_Man_t *p,int nCrossCut)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  undefined1 auVar5 [16];
  int local_24;
  int nCutSets;
  int i;
  If_Set_t *pCutSet;
  int nCrossCut_local;
  If_Man_t *p_local;
  
  _nCutSets = (If_Set_t *)malloc((long)((nCrossCut + 0x80) * p->nSetBytes));
  p->pMemAnd = _nCutSets;
  p->pFreeList = _nCutSets;
  for (local_24 = 0; local_24 < nCrossCut + 0x80; local_24 = local_24 + 1) {
    If_ManSetupSet(p,_nCutSets);
    if (local_24 == nCrossCut + 0x7f) {
      _nCutSets->pNext = (If_Set_t *)0x0;
    }
    else {
      _nCutSets->pNext = (If_Set_t *)((long)&_nCutSets->nCutsMax + (long)p->nSetBytes);
    }
    _nCutSets = _nCutSets->pNext;
  }
  if (_nCutSets == (If_Set_t *)0x0) {
    if (p->pPars->fVerbose != 0) {
      uVar2 = If_ManAndNum(p);
      uVar1 = p->nChoices;
      lVar4 = (long)p->nObjBytes + 0x10;
      auVar5._8_4_ = (int)((ulong)lVar4 >> 0x20);
      auVar5._0_8_ = lVar4;
      auVar5._12_4_ = 0x45300000;
      iVar3 = If_ManObjNum(p);
      Abc_Print(1,"Node = %7d.  Ch = %5d.  Total mem = %7.2f MB. Peak cut mem = %7.2f MB.\n",
                (((auVar5._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0)) * 1.0 *
                (double)iVar3) / 1048576.0,
                ((double)p->nSetBytes * 1.0 * (double)nCrossCut) / 1048576.0,(ulong)uVar2,
                (ulong)uVar1);
    }
    return;
  }
  __assert_fail("pCutSet == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifMan.c"
                ,0x2c2,"void If_ManSetupSetAll(If_Man_t *, int)");
}

Assistant:

void If_ManSetupSetAll( If_Man_t * p, int nCrossCut )
{
    If_Set_t * pCutSet;
    int i, nCutSets;
    nCutSets = 128 + nCrossCut;
    p->pFreeList = p->pMemAnd = pCutSet = (If_Set_t *)ABC_ALLOC( char, nCutSets * p->nSetBytes );
    for ( i = 0; i < nCutSets; i++ )
    {
        If_ManSetupSet( p, pCutSet );
        if ( i == nCutSets - 1 )
            pCutSet->pNext = NULL;
        else
            pCutSet->pNext = (If_Set_t *)( (char *)pCutSet + p->nSetBytes );
        pCutSet = pCutSet->pNext;
    }
    assert( pCutSet == NULL );

    if ( p->pPars->fVerbose )
    {
        Abc_Print( 1, "Node = %7d.  Ch = %5d.  Total mem = %7.2f MB. Peak cut mem = %7.2f MB.\n", 
            If_ManAndNum(p), p->nChoices,
            1.0 * (p->nObjBytes + 2*sizeof(void *)) * If_ManObjNum(p) / (1<<20), 
            1.0 * p->nSetBytes * nCrossCut / (1<<20) );
    }
//    Abc_Print( 1, "Cross cut = %d.\n", nCrossCut );

}